

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void QSslSocketPrivate::checkSettingSslContext
               (QSslSocket *socket,shared_ptr<QSslContext> *tlsContext)

{
  pointer this;
  long in_RDI;
  long in_FS_OFFSET;
  TlsCryptograph *backend;
  shared_ptr<QSslContext> *in_stack_ffffffffffffffb8;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI != 0) {
    QSslSocket::d_func((QSslSocket *)0x3a7899);
    this = std::
           unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
           ::get((unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
                  *)0x3a78a8);
    if (this != (pointer)0x0) {
      std::shared_ptr<QSslContext>::shared_ptr
                ((shared_ptr<QSslContext> *)this,in_stack_ffffffffffffffb8);
      (**(code **)(*(long *)this + 0x68))(this,local_18);
      std::shared_ptr<QSslContext>::~shared_ptr((shared_ptr<QSslContext> *)0x3a78e8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslSocketPrivate::checkSettingSslContext(QSslSocket* socket, std::shared_ptr<QSslContext> tlsContext)
{
    if (!socket)
        return;

    if (auto *backend = socket->d_func()->backend.get())
        backend->checkSettingSslContext(tlsContext);
}